

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall stackjit::ExecutionEngine::load(ExecutionEngine *this,bool loadFunctionBodies)

{
  AssemblyImage *this_00;
  bool bVar1;
  Binder *this_01;
  vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_> *this_02;
  reference ppAVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>_>
  *this_03;
  reference signature_00;
  string *psVar3;
  runtime_error *this_04;
  ClassType *this_05;
  ClassMetadata *this_06;
  FunctionDefinition *funcDef_00;
  ClassMetadataProvider *this_07;
  FunctionDefinition local_250;
  undefined1 local_1b1;
  char local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  FunctionSignature local_170;
  string local_150 [8];
  string signature;
  string local_120 [32];
  undefined1 local_100 [8];
  FunctionDefinition funcDef;
  Function *currentFunc;
  value_type *current;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>_>
  *__range2;
  AssemblyImage **image;
  const_iterator __end1;
  const_iterator __begin1;
  vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_> *__range1;
  Binder *binder;
  bool loadFunctionBodies_local;
  ExecutionEngine *this_local;
  
  this_01 = VMState::binder(this->mVMState);
  if ((this->mHasMainInitialized & 1U) == 0) {
    loadRuntimeLibrary(this);
  }
  ClassLoader::loadClasses(&this->mClassLoader,&this->mImageContainer);
  if ((this->mHasMainInitialized & 1U) == 0) {
    NativeLibrary::add(this->mVMState);
    if (((this->mVMState->config).testMode & 1U) != 0) {
      TestLibrary::add(this->mVMState);
    }
    this->mHasMainInitialized = true;
  }
  this_02 = ImageContainer::images(&this->mImageContainer);
  __end1 = std::vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>::begin
                     (this_02);
  image = (AssemblyImage **)
          std::vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>::end
                    (this_02);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<stackjit::AssemblyImage_*const_*,_std::vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>_>
                                *)&image);
    if (!bVar1) {
      this_07 = VMState::classProvider(this->mVMState);
      ClassMetadataProvider::createVirtualFunctionTables(this_07,this->mVMState);
      return;
    }
    ppAVar2 = __gnu_cxx::
              __normal_iterator<stackjit::AssemblyImage_*const_*,_std::vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>_>
              ::operator*(&__end1);
    bVar1 = AssemblyImage::hasLoadedDefinitions(*ppAVar2);
    if (!bVar1) {
      this_03 = AssemblyImage::functions_abi_cxx11_(*ppAVar2);
      __end2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>_>
               ::begin(this_03);
      current = (value_type *)
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>_>
                ::end(this_03);
      while (bVar1 = std::__detail::operator!=
                               (&__end2.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>,_true>
                                ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>,_true>
                                  *)&current), bVar1) {
        signature_00 = std::__detail::
                       _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>,_false,_true>
                       ::operator*(&__end2);
        funcDef._144_8_ = &signature_00->second;
        FunctionDefinition::FunctionDefinition((FunctionDefinition *)local_100);
        if (loadFunctionBodies) {
          this_00 = *ppAVar2;
          std::__cxx11::string::string(local_120,(string *)signature_00);
          AssemblyImage::loadFunctionBody(this_00,(string *)local_120);
          std::__cxx11::string::~string(local_120);
        }
        bVar1 = Loader::Function::isExternal((Function *)funcDef._144_8_);
        if (bVar1) {
          FunctionLoader::loadExternal
                    (&this->mFunctionLoader,(Function *)funcDef._144_8_,
                     (FunctionDefinition *)local_100);
        }
        else {
          FunctionLoader::generateDefinition
                    (&this->mFunctionLoader,(Function *)funcDef._144_8_,
                     (FunctionDefinition *)local_100);
          FunctionSignature::from(&local_170,(FunctionDefinition *)local_100);
          psVar3 = FunctionSignature::str_abi_cxx11_(&local_170);
          std::__cxx11::string::string(local_150,(string *)psVar3);
          FunctionSignature::~FunctionSignature(&local_170);
          bVar1 = Binder::isDefined(this_01,(string *)local_150);
          if (bVar1) {
            local_1b1 = 1;
            this_04 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(local_1b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "The function \'");
            std::operator+(local_190,local_1b0);
            std::runtime_error::runtime_error(this_04,(string *)local_190);
            local_1b1 = 0;
            __cxa_throw(this_04,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::string::~string(local_150);
        }
        FunctionDefinition::FunctionDefinition(&local_250,(FunctionDefinition *)local_100);
        Binder::define(this_01,&local_250);
        FunctionDefinition::~FunctionDefinition(&local_250);
        bVar1 = FunctionDefinition::isVirtual((FunctionDefinition *)local_100);
        if (bVar1) {
          this_05 = FunctionDefinition::classType((FunctionDefinition *)local_100);
          this_06 = ClassType::metadata(this_05);
          funcDef_00 = Binder::getFunction(this_01,&signature_00->first);
          ClassMetadata::addVirtualFunction(this_06,funcDef_00);
        }
        FunctionDefinition::~FunctionDefinition((FunctionDefinition *)local_100);
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>,_false,_true>
        ::operator++(&__end2);
      }
      AssemblyImage::loadedDefinitions(*ppAVar2);
    }
    __gnu_cxx::
    __normal_iterator<stackjit::AssemblyImage_*const_*,_std::vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void ExecutionEngine::load(bool loadFunctionBodies) {
		auto& binder = mVMState.binder();

		if (!mHasMainInitialized) {
			//Load runtime library
			loadRuntimeLibrary();
		}

		//Load classes
		mClassLoader.loadClasses(mImageContainer);

		if (!mHasMainInitialized) {
			//Load native functions
			NativeLibrary::add(mVMState);

			//Load test functions
			if (mVMState.config.testMode) {
				TestLibrary::add(mVMState);
			}

			mHasMainInitialized = true; //Mark that the main initialization has been made
		}

		//Load functions
		for (auto& image : mImageContainer.images()) {
			if (image->hasLoadedDefinitions()) {
				continue;
			}

			for (auto& current : image->functions()) {
				auto& currentFunc = current.second;
				FunctionDefinition funcDef;

				if (loadFunctionBodies) {
					image->loadFunctionBody(current.first);
				}

				if (!currentFunc.isExternal()) {
					mFunctionLoader.generateDefinition(currentFunc, funcDef);

					auto signature = FunctionSignature::from(funcDef).str();
					if (binder.isDefined(signature)) {
						throw std::runtime_error("The function '" + signature + "' is already defined.");
					}
				} else {
					mFunctionLoader.loadExternal(currentFunc, funcDef);
				}

				binder.define(funcDef);

				//Add virtual functions to the class
				if (funcDef.isVirtual()) {
					funcDef.classType()->metadata()->addVirtualFunction(binder.getFunction(current.first));
				}
			}

			image->loadedDefinitions();
		}

		//Create virtual function tables
		mVMState.classProvider().createVirtualFunctionTables(mVMState);
	}